

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_tools.cxx
# Opt level: O2

void __thiscall dds_tools::process(dds_tools *this,cl_parser *cl)

{
  bool bVar1;
  xr_file_system *this_00;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = check_paths(this);
  if (bVar1) {
    bVar1 = cl_parser::get_bool(cl,"-with_solid");
    this->m_with_solid = bVar1;
    bVar1 = cl_parser::get_bool(cl,"-with_bump");
    this->m_with_bump = bVar1;
    this_00 = xray_re::xr_file_system::instance();
    xray_re::xr_file_system::resolve_path(this_00,"$game_textures$");
    std::__cxx11::string::assign((char *)&this->m_textures);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
    process_folder(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void dds_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	m_with_solid = cl.get_bool("-with_solid");
	m_with_bump = cl.get_bool("-with_bump");

	xr_file_system& fs = xr_file_system::instance();
	m_textures = fs.resolve_path(PA_GAME_TEXTURES);

	process_folder();
}